

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

size_t fio_str_utf8_valid(fio_str_s *s)

{
  uint uVar1;
  size_t sVar2;
  int32_t c;
  char *end;
  fio_str_info_s state;
  fio_str_s *s_local;
  
  if (s == (fio_str_s *)0x0) {
    s_local = (fio_str_s *)0x0;
  }
  else {
    state.data = (char *)s;
    fio_str_info((fio_str_info_s *)&end,s);
    if (state.capa == 0) {
      s_local = (fio_str_s *)&DAT_00000001;
    }
    else {
      uVar1 = fio_str_utf8_map[*(byte *)state.len >> 3] - 1;
      if (uVar1 < 3 || fio_str_utf8_map[*(byte *)state.len >> 3] == 4) {
        sVar2 = (*(code *)(&DAT_0019d448 + *(int *)(&DAT_0019d448 + (ulong)uVar1 * 4)))();
        return sVar2;
      }
      s_local = (fio_str_s *)0x0;
    }
  }
  return (size_t)s_local;
}

Assistant:

FIO_FUNC size_t fio_str_utf8_valid(fio_str_s *s) {
  if (!s)
    return 0;
  fio_str_info_s state = fio_str_info(s);
  if (!state.len)
    return 1;
  char *const end = state.data + state.len;
  int32_t c = 0;
  do {
    FIO_STR_UTF8_CODE_POINT(state.data, end, c);
  } while (c > 0 && state.data < end);
  return state.data == end && c >= 0;
}